

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

void __thiscall nuraft::buffer_serializer::get_buffer(buffer_serializer *this,ptr<buffer> *dst)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  byte *pbVar4;
  byte *__dest;
  
  sVar2 = buffer::size((dst->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  sVar3 = buffer::pos((dst->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pbVar4 = buffer::data_begin(this->buf_);
  sVar1 = this->pos_;
  pos(this,sVar1 + (sVar2 - sVar3));
  __dest = buffer::data((dst->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       );
  memcpy(__dest,pbVar4 + sVar1,sVar2 - sVar3);
  return;
}

Assistant:

void buffer_serializer::get_buffer(ptr<buffer>& dst) {
    size_t len = dst->size() - dst->pos();
    void* ptr = get_raw(len);
    ::memcpy(dst->data(), ptr, len);
}